

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::ParseFile(AMFImporter *this,string *pFile,IOSystem *pIOHandler)

{
  IrrXMLReader *pIVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  CIrrXML_IOStreamReader *this_00;
  IrrXMLReader *pIVar4;
  DeadlyImportError *pDVar5;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IOStream *_stream;
  
  pIVar1 = this->mReader;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"rb",(allocator<char> *)&local_50);
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,local_70._M_dataplus._M_p);
  _stream = (IOStream *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::~string((string *)&local_70);
  if (_stream == (IOStream *)0x0) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to open AMF file ",pFile);
    std::operator+(&local_70,&local_50,".");
    DeadlyImportError::DeadlyImportError(pDVar5,&local_70);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
  pIVar4 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
  this->mReader = pIVar4;
  if (pIVar4 != (IrrXMLReader *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"amf",(allocator<char> *)&local_50);
    bVar2 = XML_SearchNode(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      ParseNode_Root(this);
      if (this->mReader != (IrrXMLReader *)0x0) {
        (*this->mReader->_vptr_IIrrXMLReader[1])();
      }
      this->mReader = pIVar1;
      (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
      (*_stream->_vptr_IOStream[1])(_stream);
      return;
    }
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Root node \"amf\" not found.",(allocator<char> *)&local_50);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_70);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"Failed to create XML reader for file",pFile);
  std::operator+(&local_70,&local_50,".");
  DeadlyImportError::DeadlyImportError(pDVar5,&local_70);
  __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::ParseFile(const std::string& pFile, IOSystem* pIOHandler)
{
    irr::io::IrrXMLReader* OldReader = mReader;// store current XMLreader.
    std::unique_ptr<IOStream> file(pIOHandler->Open(pFile, "rb"));

	// Check whether we can read from the file
	if(file.get() == NULL) throw DeadlyImportError("Failed to open AMF file " + pFile + ".");

	// generate a XML reader for it
	std::unique_ptr<CIrrXML_IOStreamReader> mIOWrapper(new CIrrXML_IOStreamReader(file.get()));
	mReader = irr::io::createIrrXMLReader(mIOWrapper.get());
	if(!mReader) throw DeadlyImportError("Failed to create XML reader for file" + pFile + ".");
	//
	// start reading
	// search for root tag <amf>
	if(XML_SearchNode("amf"))
		ParseNode_Root();
	else
		throw DeadlyImportError("Root node \"amf\" not found.");

	delete mReader;
	// restore old XMLreader
	mReader = OldReader;
}